

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

string * nonius::html_reporter::escape(string *__return_storage_ptr__,string *source)

{
  int iVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 local_121;
  undefined1 local_120;
  undefined1 local_11f;
  char local_11e [6];
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  if (escape(std::__cxx11::string_const&)::escapes_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&escape(std::__cxx11::string_const&)::escapes_abi_cxx11_);
    if (iVar1 != 0) {
      local_11e[5] = 0x27;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>(&local_118,local_11e + 5,(char (*) [7])"&apos;");
      local_11e[4] = 0x22;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>(&local_f0,local_11e + 4,(char (*) [7])"&quot;");
      local_11e[3] = 0x3c;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_c8,local_11e + 3,(char (*) [5])"&lt;");
      local_11e[2] = 0x3e;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_a0,local_11e + 2,(char (*) [5])"&gt;");
      local_11e[1] = 0x26;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_78,local_11e + 1,(char (*) [6])"&amp;");
      local_11e[0] = '\\';
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[3],_true>(&local_50,local_11e,(char (*) [3])"\\\\");
      std::
      _Hashtable<char,std::pair<char_const,std::__cxx11::string>,std::allocator<std::pair<char_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<char_const,std::__cxx11::string>const*>
                ((_Hashtable<char,std::pair<char_const,std::__cxx11::string>,std::allocator<std::pair<char_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&escape(std::__cxx11::string_const&)::escapes_abi_cxx11_,&local_118,
                 &stack0xffffffffffffffd8,0,&local_11f,&local_120,&local_121);
      lVar2 = -0xf0;
      paVar3 = &local_50.second.field_2;
      do {
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar3->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar3->_M_allocated_capacity)[-2],
                          paVar3->_M_allocated_capacity + 1);
        }
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar3->_M_allocated_capacity + -5);
        lVar2 = lVar2 + 0x28;
      } while (lVar2 != 0);
      __cxa_atexit(std::
                   unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,&escape(std::__cxx11::string_const&)::escapes_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&escape(std::__cxx11::string_const&)::escapes_abi_cxx11_);
    }
  }
  detail::escape(__return_storage_ptr__,source,
                 &escape(std::__cxx11::string_const&)::escapes_abi_cxx11_);
  return __return_storage_ptr__;
}

Assistant:

static std::string escape(std::string const& source) {
            static const std::unordered_map<char, std::string> escapes {
                { '\'', "&apos;" },
                { '"',  "&quot;" },
                { '<',  "&lt;"   },
                { '>',  "&gt;"   },
                { '&',  "&amp;"  },
                { '\\',  "\\\\"  },
            };
            return detail::escape(source, escapes);
        }